

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqtable.h
# Opt level: O2

SQHash HashObj(SQObjectPtr *key)

{
  SQObjectType SVar1;
  
  SVar1 = (key->super_SQObject)._type;
  if ((SVar1 == OT_BOOL) || (SVar1 == OT_INTEGER)) {
    return (SQHash)(key->super_SQObject)._unVal.pTable;
  }
  if (SVar1 == OT_FLOAT) {
    return (long)(key->super_SQObject)._unVal.fFloat;
  }
  if (SVar1 == OT_STRING) {
    return (SQHash)(((key->super_SQObject)._unVal.pTable)->super_SQDelegable)._delegate;
  }
  return (key->super_SQObject)._unVal.nInteger >> 3;
}

Assistant:

inline SQHash HashObj(const SQObjectPtr &key)
{
    switch(sq_type(key)) {
        case OT_STRING:     return _string(key)->_hash;
        case OT_FLOAT:      return (SQHash)((SQInteger)_float(key));
        case OT_BOOL: case OT_INTEGER:  return (SQHash)((SQInteger)_integer(key));
        default:            return hashptr(key._unVal.pRefCounted);
    }
}